

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O1

void TemplateCacheUnittest::TestRecursiveInclude(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  long lVar3;
  string incname;
  TemplateDictionary dict;
  TemplateCache cache;
  undefined7 uStack_12f;
  undefined1 local_120 [32];
  string local_100;
  pointer local_e0;
  size_type sStack_d8;
  undefined1 local_d0;
  uint7 uStack_cf;
  undefined8 uStack_c8;
  string local_c0 [3];
  TemplateString local_50 [2];
  
  ctemplate::TemplateCache::TemplateCache((TemplateCache *)local_50);
  local_c0[0]._M_dataplus._M_p = (pointer)&local_c0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_c0,"hi {{>INC}} bar\n  {{>INC}}!","");
  ctemplate::StringToTemplateFile(&local_100,local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0[0]._M_dataplus._M_p != &local_c0[0].field_2) {
    operator_delete(local_c0[0]._M_dataplus._M_p);
  }
  local_c0[0]._M_dataplus._M_p = local_100._M_dataplus._M_p;
  local_c0[0]._M_string_length = local_100._M_string_length;
  local_c0[0].field_2._M_local_buf[0] = '\0';
  local_c0[0].field_2._8_8_ = 0;
  lVar3 = ctemplate::TemplateCache::GetTemplate(local_50,(Strip)local_c0);
  if (lVar3 != 0) {
    local_120._0_8_ = "dict";
    local_120._8_8_ = 4;
    local_120[0x10] = true;
    local_120._24_8_ = 0;
    ctemplate::TemplateDictionary::TemplateDictionary
              ((TemplateDictionary *)local_c0,(TemplateString *)local_120,(UnsafeArena *)0x0);
    TVar1._17_7_ = uStack_12f;
    TVar1.is_immutable_ = true;
    TVar1.length_ = 3;
    TVar1.ptr_ = "INC";
    TVar1.id_ = 0;
    ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
    local_e0 = local_100._M_dataplus._M_p;
    sStack_d8 = local_100._M_string_length;
    local_d0 = 0;
    uStack_c8 = 0;
    TVar2.length_ = local_100._M_string_length;
    TVar2.ptr_ = local_100._M_dataplus._M_p;
    TVar2._16_8_ = (ulong)uStack_cf << 8;
    TVar2.id_ = 0;
    ctemplate::TemplateDictionary::SetFilename(TVar2);
    local_120._0_8_ = local_120 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"hi hi  bar\n  ! bar\n  hi  bar\n    !!","");
    ctemplate::AssertExpandWithCacheIs
              ((TemplateCache *)local_50,&local_100,DO_NOT_STRIP,(TemplateDictionary *)local_c0,
               (PerExpandData *)0x0,(string *)local_120,true);
    if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
      operator_delete((void *)local_120._0_8_);
    }
    ctemplate::TemplateDictionary::~TemplateDictionary((TemplateDictionary *)local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100._M_dataplus._M_p != &local_100.field_2) {
      operator_delete(local_100._M_dataplus._M_p);
    }
    ctemplate::TemplateCache::~TemplateCache((TemplateCache *)local_50);
    return;
  }
  printf("ASSERT FAILED, line %d: %s\n",0x390,"tpl");
  __assert_fail("tpl",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                ,0x390,"static void TemplateCacheUnittest::TestRecursiveInclude()");
}

Assistant:

static void TestRecursiveInclude() {
    TemplateCache cache;
    string incname = StringToTemplateFile("hi {{>INC}} bar\n  {{>INC}}!");
    const Template* tpl = cache.GetTemplate(incname, DO_NOT_STRIP);
    ASSERT(tpl);
    TemplateDictionary dict("dict");
    dict.AddIncludeDictionary("INC")->SetFilename(incname);
    // Note the last line is indented 4 spaces instead of 2.  This is
    // because the last sub-include is indented.
    AssertExpandWithCacheIs(&cache, incname, DO_NOT_STRIP, &dict, NULL,
                            "hi hi  bar\n  ! bar\n  hi  bar\n    !!",
                            true);
  }